

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectiveFunction.hpp
# Opt level: O0

void __thiscall
QuantLib::ObjectiveFunction::gradient
          (ObjectiveFunction *this,DynamicVector<double,_std::allocator<double>_> *grad,
          DynamicVector<double,_std::allocator<double>_> *x)

{
  size_type sVar1;
  reference pvVar2;
  const_reference pvVar3;
  long *in_RDI;
  double dVar4;
  size_t i;
  DynamicVector<double,_std::allocator<double>_> xx;
  RealType fm;
  RealType fp;
  RealType eps;
  DynamicVector<double,_std::allocator<double>_> *in_stack_ffffffffffffff38;
  DynamicVector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  ulong local_50;
  undefined1 local_48 [24];
  double local_30;
  double local_28;
  double local_20;
  
  local_20 = (double)(**(code **)(*in_RDI + 0x28))();
  OpenMD::DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_50 = 0;
  while( true ) {
    sVar1 = OpenMD::DynamicVector<double,_std::allocator<double>_>::size
                      ((DynamicVector<double,_std::allocator<double>_> *)0x385e10);
    dVar4 = local_20;
    if (sVar1 <= local_50) break;
    pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                       (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
    *pvVar2 = *pvVar2 + dVar4;
    local_28 = (double)(**(code **)(*in_RDI + 0x10))(in_RDI,local_48);
    dVar4 = local_20;
    pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                       (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
    *pvVar2 = *pvVar2 - (dVar4 + dVar4);
    local_30 = (double)(**(code **)(*in_RDI + 0x10))(in_RDI,local_48);
    dVar4 = ((local_28 - local_30) * 0.5) / local_20;
    pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                       (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
    *pvVar2 = dVar4;
    pvVar3 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                       (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff38 = (DynamicVector<double,_std::allocator<double>_> *)*pvVar3;
    in_stack_ffffffffffffff40 =
         (DynamicVector<double,_std::allocator<double>_> *)
         OpenMD::DynamicVector<double,_std::allocator<double>_>::operator[]
                   (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
    (in_stack_ffffffffffffff40->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff38;
    local_50 = local_50 + 1;
  }
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x385fe5);
  return;
}

Assistant:

virtual void gradient(DynamicVector<RealType>& grad,
                          const DynamicVector<RealType>& x) {
      RealType eps = finiteDifferenceEpsilon(), fp, fm;
      DynamicVector<RealType> xx(x);
      for (size_t i = 0; i < x.size(); i++) {
        xx[i] += eps;
        fp = value(xx);
        xx[i] -= 2.0 * eps;
        fm      = value(xx);
        grad[i] = 0.5 * (fp - fm) / eps;
        xx[i]   = x[i];
      }
    }